

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O1

bool __thiscall
TypeEnum::getMatches
          (TypeEnum *this,uintb val,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *valnames)

{
  _Rb_tree_header *p_Var1;
  byte in_AL;
  int iVar2;
  pointer puVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  int iVar7;
  ulong uVar8;
  _Rb_tree_header *p_Var9;
  bool bVar10;
  
  p_Var1 = &(this->namemap)._M_t._M_impl.super__Rb_tree_header;
  iVar7 = 0;
  do {
    if (val == 0) {
      p_Var5 = &p_Var1->_M_header;
      for (p_Var6 = (this->namemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0; p_Var6 = p_Var6->_M_left) {
        p_Var5 = p_Var6;
      }
      p_Var9 = p_Var1;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var9 = (_Rb_tree_header *)p_Var5, ((_Rb_tree_header *)p_Var5)->_M_node_count != 0)) {
        p_Var9 = p_Var1;
      }
      if (p_Var9 != p_Var1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(valnames,(value_type *)(p_Var9 + 1));
        goto LAB_002732d1;
      }
      bVar10 = false;
    }
    else {
      puVar3 = (this->masklist).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->masklist).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish == puVar3) {
LAB_002732d1:
        bVar10 = true;
      }
      else {
        bVar10 = true;
        uVar8 = 0;
        do {
          uVar4 = puVar3[uVar8] & val;
          if (uVar4 == 0) {
            iVar2 = 7;
          }
          else {
            p_Var5 = (this->namemap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var6 = &p_Var1->_M_header;
            for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
                p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < uVar4]) {
              if (*(ulong *)(p_Var5 + 1) >= uVar4) {
                p_Var6 = p_Var5;
              }
            }
            p_Var9 = p_Var1;
            if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
               (p_Var9 = (_Rb_tree_header *)p_Var6,
               uVar4 < ((_Rb_tree_header *)p_Var6)->_M_node_count)) {
              p_Var9 = p_Var1;
            }
            iVar2 = 0;
            if (p_Var9 == p_Var1) {
              iVar2 = 5;
              bVar10 = false;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(valnames,(value_type *)(p_Var9 + 1));
            }
          }
          if ((iVar2 != 7) && (iVar2 != 0)) break;
          uVar8 = uVar8 + 1;
          puVar3 = (this->masklist).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)((long)(this->masklist).
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >>
                                3));
      }
    }
    if (bVar10) {
      in_AL = iVar7 != 0;
    }
    else {
      iVar2 = (this->super_TypeBase).super_Datatype.size;
      if (7 < iVar2) {
        iVar2 = 8;
      }
      val = val ^ uintbmasks[iVar2];
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(valnames);
    }
    if (bVar10) goto LAB_0027332a;
    bVar10 = iVar7 == 0;
    iVar7 = iVar7 + 1;
  } while (bVar10);
  in_AL = 0;
LAB_0027332a:
  return (bool)(in_AL & 1);
}

Assistant:

bool TypeEnum::getMatches(uintb val,vector<string> &valnames) const

{
  map<uintb,string>::const_iterator iter;
  int4 count;

  for(count=0;count<2;++count) {
    bool allmatch = true;
    if (val == 0) {	// Zero handled specially, it crosses all masks
      iter = namemap.find(val);
      if (iter != namemap.end())
	valnames.push_back( (*iter).second );
      else
	allmatch = false;
    }
    else {
      for(int4 i=0;i<masklist.size();++i) {
	uintb maskedval = val & masklist[i];
	if (maskedval == 0)	// No component of -val- in this mask
	  continue;		// print nothing
	iter = namemap.find(maskedval);
	if (iter != namemap.end())
	  valnames.push_back( (*iter).second );	// Found name for this component
	else {					// If no name for this component
	  allmatch = false;			// Give up on representation
	  break;				// Stop searching for other components
	}
      }
    }
    if (allmatch)			// If we have a complete representation
      return (count==1);		// Return whether we represented original value or complement
    val = val ^ calc_mask(size);	// Switch value we are trying to represent (to complement)
    valnames.clear();			// Clear out old attempt
  }
  return false;	// If we reach here, no representation was possible, -valnames- is empty
}